

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

LYD_FORMAT detect_data_format(char *filepath)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  
  sVar2 = strlen(filepath);
  ppuVar3 = __ctype_b_loc();
  while ((*(byte *)((long)*ppuVar3 + (long)filepath[sVar2 - 1] * 2 + 1) & 0x20) != 0) {
    filepath[sVar2 - 1] = '\0';
    sVar2 = sVar2 - 1;
  }
  if (4 < sVar2) {
    iVar1 = strcmp(filepath + (sVar2 - 4),".xml");
    if (iVar1 == 0) {
      return LYD_XML;
    }
    if ((sVar2 != 5) && (iVar1 = strcmp(filepath + (sVar2 - 5),".json"), iVar1 == 0)) {
      return LYD_JSON;
    }
    iVar1 = strcmp(filepath + (sVar2 - 4),".lyb");
    if (iVar1 == 0) {
      return LYD_LYB;
    }
  }
  return LYD_UNKNOWN;
}

Assistant:

static LYD_FORMAT
detect_data_format(char *filepath)
{
    size_t len;

    /* detect input format according to file suffix */
    len = strlen(filepath);
    for (; isspace(filepath[len - 1]); len--, filepath[len] = '\0'); /* remove trailing whitespaces */
    if (len >= 5 && !strcmp(&filepath[len - 4], ".xml")) {
        return LYD_XML;
    } else if (len >= 6 && !strcmp(&filepath[len - 5], ".json")) {
        return LYD_JSON;
    } else if (len >= 5 && !strcmp(&filepath[len - 4], ".lyb")) {
        return LYD_LYB;
    } else {
        return LYD_UNKNOWN;
    }
}